

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBindCopy
          (ClientContext *context,CopyInfo *info,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expected_names,vector<duckdb::LogicalType,_true> *expected_types)

{
  case_insensitive_map_t<Value> *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var3;
  bool bVar4;
  type file_options;
  pointer pMVar5;
  NotImplementedException *this_00;
  pointer pbVar6;
  vector<duckdb::LogicalType,_true> *in_R8;
  vector<duckdb::LogicalType,_true> *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_209;
  unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
  multi_file_reader;
  unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
  options;
  _Head_base<0UL,_duckdb::MultiFileReader_*,_false> local_1f8;
  _Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false> local_1f0;
  shared_ptr<duckdb::MultiFileList,_true> file_list;
  element_type local_1d8 [16];
  shared_ptr<duckdb::MultiFileList,_true> local_1c8;
  vector<duckdb::LogicalType,_true> *local_1b8;
  vector<duckdb::LogicalType,_true> *local_1b0;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  paths;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined1 local_170 [16];
  MultiFileOptions local_160;
  MultiFileOptions local_c8;
  
  local_1b8 = in_R8;
  local_1b0 = expected_types;
  local_1a8._M_head_impl = (FunctionData *)context;
  ParquetMultiFileInfo::InitializeOptions
            ((ClientContext *)&options,(optional_ptr<duckdb::TableFunctionInfo,_true>)info);
  local_160.hive_types_schema._M_h._M_buckets = &local_160.hive_types_schema._M_h._M_single_bucket;
  local_160.filename = false;
  local_160.hive_partitioning = false;
  local_160.auto_detect_hive_partitioning = true;
  local_160.union_by_name = false;
  local_160.hive_types_autocast = true;
  local_160.mapping = BY_NAME;
  local_160.hive_types_schema._M_h._M_bucket_count = 1;
  local_160.hive_types_schema._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_160.hive_types_schema._M_h._M_element_count = 0;
  local_160.hive_types_schema._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_160.hive_types_schema._M_h._M_rehash_policy._M_next_resize = 0;
  local_160.hive_types_schema._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_160.filename_column._M_dataplus._M_p = (pointer)&local_160.filename_column.field_2;
  local_160.filename_column.field_2._M_allocated_capacity = 0x656d616e656c6966;
  local_160.filename_column._M_string_length = 8;
  local_160.filename_column.field_2._8_4_ = local_160.filename_column.field_2._8_4_ & 0xffffff00;
  local_160.custom_options._M_h._M_buckets = &local_160.custom_options._M_h._M_single_bucket;
  local_160.custom_options._M_h._M_bucket_count = 1;
  local_160.custom_options._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_160.custom_options._M_h._M_element_count = 0;
  local_160.custom_options._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_160.custom_options._M_h._M_rehash_policy._M_next_resize = 0;
  local_160.custom_options._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pbVar6 = expected_names[9].
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != (pointer)0x0) {
    do {
      duckdb::StringUtil::Lower((string *)&file_list);
      file_options = unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                     ::operator*(&options);
      bVar4 = ParquetMultiFileInfo::ParseCopyOption
                        ((ClientContext *)info,(string *)&file_list,
                         (vector<duckdb::Value,_true> *)&pbVar6[1]._M_string_length,file_options,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)in_R8,in_R9);
      if (!bVar4) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        paths.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&paths.
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&paths,"Unsupported option for COPY FROM: %s","");
        local_180._M_allocated_capacity = (size_type)local_170;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_180,pbVar6->_M_string_length,
                   (pbVar6->field_2)._M_allocated_capacity + pbVar6->_M_string_length);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_00,(string *)&paths,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
      }
      if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != local_1d8) {
        operator_delete(file_list.internal.
                        super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
      }
      pbVar6 = (pointer)(pbVar6->_M_dataplus)._M_p;
    } while (pbVar6 != (pointer)0x0);
  }
  unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
  ::operator*(&options);
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&file_list,"COPY","");
  duckdb::MultiFileReader::CreateDefault((string *)&multi_file_reader);
  if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != local_1d8) {
    operator_delete(file_list.internal.
                    super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pbVar6 = expected_names[7].
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file_list,pbVar6,
             (long)&((expected_names[7].
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus)._M_p +
             (long)pbVar6);
  __l._M_len = 1;
  __l._M_array = (iterator)&file_list;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,__l,&local_209);
  if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != local_1d8) {
    operator_delete(file_list.internal.
                    super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  pMVar5 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->(&multi_file_reader);
  (**(code **)(*(long *)pMVar5 + 0x18))(&file_list,pMVar5,info,&paths,0);
  this = &local_160.custom_options;
  local_1f8._M_head_impl =
       (MultiFileReader *)
       multi_file_reader.
       super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
       .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl;
  multi_file_reader.
  super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>.
  super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl =
       (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)
       (__uniq_ptr_data<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true,_true>
        )0x0;
  local_1c8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_1c8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_c8.filename = local_160.filename;
  local_c8.hive_partitioning = local_160.hive_partitioning;
  local_c8.auto_detect_hive_partitioning = local_160.auto_detect_hive_partitioning;
  local_c8.union_by_name = local_160.union_by_name;
  local_c8.hive_types_autocast = local_160.hive_types_autocast;
  local_c8.mapping = local_160.mapping;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_c8.hive_types_schema._M_h,&local_160.hive_types_schema);
  paVar1 = &local_c8.filename_column.field_2;
  paVar2 = &local_160.filename_column.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename_column._M_dataplus._M_p == paVar2) {
    local_c8.filename_column.field_2._8_4_ = local_160.filename_column.field_2._8_4_;
    local_c8.filename_column.field_2._12_4_ = local_160.filename_column.field_2._12_4_;
    local_c8.filename_column._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_c8.filename_column._M_dataplus._M_p = local_160.filename_column._M_dataplus._M_p;
  }
  local_c8.filename_column.field_2._M_allocated_capacity =
       local_160.filename_column.field_2._M_allocated_capacity;
  local_c8.filename_column._M_string_length = local_160.filename_column._M_string_length;
  local_160.filename_column._M_string_length = 0;
  local_160.filename_column.field_2._M_allocated_capacity =
       local_160.filename_column.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_160.filename_column._M_dataplus._M_p = (pointer)paVar2;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_c8.custom_options._M_h,this,this);
  _Var3._M_head_impl = local_1a8._M_head_impl;
  local_1f0._M_head_impl =
       (BaseFileReaderOptions *)
       options.
       super_unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BaseFileReaderOptions_*,_std::default_delete<duckdb::BaseFileReaderOptions>_>
       .super__Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false>._M_head_impl;
  options.
  super_unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BaseFileReaderOptions_*,_std::default_delete<duckdb::BaseFileReaderOptions>_>
  .super__Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false>._M_head_impl =
       (unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
        )(__uniq_ptr_data<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true,_true>
          )0x0;
  MultiFileBindInternal
            ((MultiFileFunction<duckdb::ParquetMultiFileInfo> *)local_1a8._M_head_impl,
             (ClientContext *)info,
             (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
              *)&local_1f8,&local_1c8,local_1b8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)local_1b0,&local_c8,
             (unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
              *)&local_1f0);
  if ((_Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false>)local_1f0._M_head_impl !=
      (_Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false>)0x0) {
    (*(local_1f0._M_head_impl)->_vptr_BaseFileReaderOptions[1])();
  }
  local_1f0._M_head_impl = (BaseFileReaderOptions *)0x0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.custom_options._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.filename_column._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.filename_column._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_c8.hive_types_schema._M_h);
  if (local_1c8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_1f8._M_head_impl != (MultiFileReader *)0x0) {
    (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
  }
  local_1f8._M_head_impl = (MultiFileReader *)0x0;
  if (file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (file_list.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&paths.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  if (multi_file_reader.
      super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>._M_t.
      super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
      .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)multi_file_reader.
                          super_unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::MultiFileReader_*,_std::default_delete<duckdb::MultiFileReader>_>
                          .super__Head_base<0UL,_duckdb::MultiFileReader_*,_false>._M_head_impl + 8)
    )();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this->_M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.filename_column._M_dataplus._M_p != &local_160.filename_column.field_2) {
    operator_delete(local_160.filename_column._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_160.hive_types_schema._M_h);
  if (options.
      super_unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BaseFileReaderOptions_*,_std::default_delete<duckdb::BaseFileReaderOptions>_>
      .super__Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)options.
                          super_unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::BaseFileReaderOptions_*,_std::default_delete<duckdb::BaseFileReaderOptions>_>
                          .super__Head_base<0UL,_duckdb::BaseFileReaderOptions_*,_false>.
                          _M_head_impl + 8))();
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         _Var3._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> MultiFileBindCopy(ClientContext &context, CopyInfo &info,
	                                                  vector<string> &expected_names,
	                                                  vector<LogicalType> &expected_types) {
		auto options = OP::InitializeOptions(context, nullptr);
		MultiFileOptions file_options;

		for (auto &option : info.options) {
			auto loption = StringUtil::Lower(option.first);
			if (OP::ParseCopyOption(context, loption, option.second, *options, expected_names, expected_types)) {
				continue;
			}
			throw NotImplementedException("Unsupported option for COPY FROM: %s", option.first);
		}
		OP::FinalizeCopyBind(context, *options, expected_names, expected_types);

		// TODO: Allow overriding the MultiFileReader for COPY FROM?
		auto multi_file_reader = MultiFileReader::CreateDefault("COPY");
		vector<string> paths = {info.file_path};
		auto file_list = multi_file_reader->CreateFileList(context, paths);

		return MultiFileBindInternal(context, std::move(multi_file_reader), std::move(file_list), expected_types,
		                             expected_names, std::move(file_options), std::move(options));
	}